

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O3

void __thiscall pstore::storage::update_master_pointers(storage *this,size_t old_length)

{
  sat_iterator segment_end;
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  ulong uVar4;
  sat_iterator segment_it;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var5;
  sat_iterator pvVar6;
  long lVar7;
  shared_ptr<pstore::memory_mapper_base> *region;
  
  psVar1 = (this->regions_).
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (old_length == 0) {
    _Var5._M_head_impl =
         (this->sat_)._M_t.
         super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
    uVar4 = 0;
  }
  else {
    psVar2 = (this->regions_).
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)psVar1 - (long)psVar2 >> 4) <= old_length) {
      assert_failed("old_length < regions_.size ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x80);
    }
    peVar3 = psVar2[old_length - 1].
             super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = peVar3->size_ + peVar3->offset_ >> 0x16;
    if (0xffff < uVar4 - 1) {
      std::__throw_out_of_range_fmt
                ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar4 - 1,0x10000);
    }
    _Var5._M_head_impl =
         (this->sat_)._M_t.
         super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
    if (*(long *)&((sat_entry *)((long)(_Var5._M_head_impl)->_M_elems + uVar4 * 0x20 + -0x20))->
                  value == 0) {
      assert_failed("sat_->at (last_sat_entry - 1).value != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x83);
    }
  }
  if ((long)old_length < 0) {
    assert_failed("old_length <= static_cast<std::make_unsigned<region_difference_type>::type> ( std::numeric_limits<region_difference_type>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                  ,0x95);
  }
  segment_end = _Var5._M_head_impl[1]._M_elems;
  segment_it = (_Var5._M_head_impl)->_M_elems + uVar4;
  for (region = (this->regions_).
                super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                ._M_impl.super__Vector_impl_data._M_start + old_length; region != psVar1;
      region = region + 1) {
    segment_it = slice_region_into_segments(region,segment_it,segment_end);
  }
  uVar4 = (long)segment_end - (long)segment_it;
  if (0 < (long)uVar4 >> 7) {
    pvVar6 = (sat_iterator)
             ((long)&(segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             + (uVar4 & 0xffffffffffffff80));
    lVar7 = ((long)uVar4 >> 7) + 1;
    segment_it = segment_it + 2;
    do {
      if (segment_it[-2].region.
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          segment_it[-2].value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        segment_it = segment_it + -2;
        goto LAB_0015e8a3;
      }
      if (segment_it[-1].region.
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          segment_it[-1].value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        segment_it = segment_it + -1;
        goto LAB_0015e8a3;
      }
      if ((segment_it->region).
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          (segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) goto LAB_0015e8a3;
      if (segment_it[1].region.
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          segment_it[1].value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        segment_it = segment_it + 1;
        goto LAB_0015e8a3;
      }
      lVar7 = lVar7 + -1;
      segment_it = segment_it + 4;
    } while (1 < lVar7);
    uVar4 = (long)segment_end - (long)pvVar6;
    segment_it = pvVar6;
  }
  lVar7 = (long)uVar4 >> 5;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      if (lVar7 != 3) {
        return;
      }
      if ((segment_it->region).
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          (segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) goto LAB_0015e8a3;
      segment_it = segment_it + 1;
    }
    if ((segment_it->region).
        super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0 ||
        (segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) goto LAB_0015e8a3;
    segment_it = segment_it + 1;
  }
  if ((segment_it->region).
      super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0 &&
      (segment_it->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    return;
  }
LAB_0015e8a3:
  if (segment_it == segment_end) {
    return;
  }
  assert_failed("std::all_of (segment_it, segment_end, [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                ,0x9f);
}

Assistant:

void storage::update_master_pointers (std::size_t const old_length) {

        std::uint64_t last_sat_entry = 0;
        if (old_length > 0) {
            PSTORE_ASSERT (old_length < regions_.size ());
            region::memory_mapper_ptr const & region = regions_[old_length - 1];
            last_sat_entry = (region->offset () + region->size ()) / address::segment_size;
            PSTORE_ASSERT (sat_->at (last_sat_entry - 1).value != nullptr);
        }

        auto segment_it = std::begin (*sat_);
        auto const segment_end = std::end (*sat_);
        using segment_difference_type =
            std::iterator_traits<decltype (segment_it)>::difference_type;

        PSTORE_ASSERT (last_sat_entry <=
                       static_cast<std::make_unsigned<segment_difference_type>::type> (
                           std::numeric_limits<segment_difference_type>::max ()));
        std::advance (segment_it, static_cast<segment_difference_type> (last_sat_entry));

        auto region_it = std::begin (regions_);
        auto const region_end = std::end (regions_);

        using region_difference_type = std::iterator_traits<decltype (region_it)>::difference_type;
        PSTORE_ASSERT (old_length <= static_cast<std::make_unsigned<region_difference_type>::type> (
                                         std::numeric_limits<region_difference_type>::max ()));
        std::advance (region_it, static_cast<region_difference_type> (old_length));

        for (; region_it != region_end; ++region_it) {
            segment_it = storage::slice_region_into_segments (*region_it, segment_it, segment_end);
        }

        // Guarantee that segments beyond the mapped memory blocks are null.
        PSTORE_ASSERT (std::all_of (segment_it, segment_end, [] (sat_entry const & s) {
            return s.value == nullptr && s.region == nullptr;
        }));
    }